

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O0

void primesieve::IteratorHelper::next
               (uint64_t *start,uint64_t *stop,uint64_t stopHint,uint64_t *dist)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  uint64_t in_RDX;
  uint64_t *in_RSI;
  ulong *in_RDI;
  uint64_t maxCachedPrime;
  uint64_t in_stack_ffffffffffffffd0;
  uint64_t in_stack_ffffffffffffffd8;
  
  uVar2 = anon_unknown.dwarf_f53e7::checkedAdd(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *in_RDI = uVar2;
  uVar2 = PrimeGenerator::maxCachedPrime();
  if (*in_RDI < uVar2) {
    *in_RSI = uVar2;
    *in_RCX = *in_RSI - *in_RDI;
  }
  else {
    uVar3 = anon_unknown.dwarf_f53e7::getNextDist((uint64_t)in_RSI,in_RDX);
    *in_RCX = uVar3;
    uVar3 = anon_unknown.dwarf_f53e7::checkedAdd(uVar2,in_stack_ffffffffffffffd0);
    *in_RSI = uVar3;
    bVar1 = anon_unknown.dwarf_f53e7::useStopHint((uint64_t)in_RCX,uVar2);
    if (bVar1) {
      anon_unknown.dwarf_f53e7::maxPrimeGap<unsigned_long>((unsigned_long)in_RCX);
      uVar2 = anon_unknown.dwarf_f53e7::checkedAdd(uVar2,in_RDX);
      *in_RSI = uVar2;
    }
  }
  return;
}

Assistant:

void IteratorHelper::next(uint64_t* start,
                          uint64_t* stop,
                          uint64_t stopHint,
                          uint64_t* dist)
{
  *start = checkedAdd(*stop, 1);
  uint64_t maxCachedPrime = PrimeGenerator::maxCachedPrime();

  if (*start < maxCachedPrime)
  {
    // When the stop number <= maxCachedPrime
    // primesieve::iterator uses the primes
    // cache instead of sieving and does not
    // even initialize Erat::init()
    *stop = maxCachedPrime;
    *dist = *stop - *start;
  }
  else
  {
    *dist = getNextDist(*start, *dist);
    *stop = checkedAdd(*start, *dist);

    if (useStopHint(*start, stopHint))
      *stop = checkedAdd(stopHint, maxPrimeGap(stopHint));
  }
}